

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O3

PGAExpr * duckdb_libpgquery::makeAExpr
                    (PGAExpr_Kind kind,PGList *name,PGNode *lexpr,PGNode *rexpr,int location)

{
  PGAExpr *pPVar1;
  
  pPVar1 = (PGAExpr *)newNode(0x28,T_PGAExpr);
  pPVar1->kind = kind;
  pPVar1->name = name;
  pPVar1->lexpr = lexpr;
  pPVar1->rexpr = rexpr;
  pPVar1->location = location;
  return pPVar1;
}

Assistant:

PGAExpr *makeAExpr(PGAExpr_Kind kind, PGList *name, PGNode *lexpr, PGNode *rexpr, int location) {
	PGAExpr *a = makeNode(PGAExpr);

	a->kind = kind;
	a->name = name;
	a->lexpr = lexpr;
	a->rexpr = rexpr;
	a->location = location;
	return a;
}